

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O3

int miniros::names::init(EVP_PKEY_CTX *ctx)

{
  _Rb_tree_node_base *name;
  _Base_ptr __n;
  int iVar1;
  _Rb_tree_node_base *in_RAX;
  string *psVar2;
  mapped_type *pmVar3;
  string resolved_right;
  string resolved_left;
  string local_70;
  string local_50;
  
  if (*(_Rb_tree_node_base **)(ctx + 0x18) != (_Rb_tree_node_base *)(ctx + 8)) {
    in_RAX = *(_Rb_tree_node_base **)(ctx + 0x18);
    do {
      if ((in_RAX[1]._M_parent != (_Base_ptr)0x0) && (name = in_RAX + 1, **(char **)name != '_')) {
        psVar2 = this_node::getName_abi_cxx11_();
        __n = in_RAX[1]._M_parent;
        if (__n == (_Base_ptr)psVar2->_M_string_length) {
          if (__n != (_Base_ptr)0x0) {
            iVar1 = bcmp(*(void **)name,(psVar2->_M_dataplus)._M_p,(size_t)__n);
            if (iVar1 != 0) goto LAB_001e69d2;
          }
        }
        else {
LAB_001e69d2:
          psVar2 = this_node::getNamespace_abi_cxx11_();
          resolve(&local_50,psVar2,(string *)name,false);
          psVar2 = this_node::getNamespace_abi_cxx11_();
          resolve(&local_70,psVar2,(string *)(in_RAX + 2),false);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)g_remappings_abi_cxx11_,&local_50);
          std::__cxx11::string::_M_assign((string *)pmVar3);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)g_unresolved_remappings_abi_cxx11_,(key_type *)name);
          std::__cxx11::string::_M_assign((string *)pmVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      in_RAX = (_Rb_tree_node_base *)std::_Rb_tree_increment(in_RAX);
    } while (in_RAX != (_Rb_tree_node_base *)(ctx + 8));
  }
  return (int)in_RAX;
}

Assistant:

void init(const M_string& remappings)
{
  for (const auto& [left, right] : remappings)
  {
    if (!left.empty() && left[0] != '_' && left != this_node::getName())
    {
      std::string resolved_left = resolve(left, false);
      std::string resolved_right = resolve(right, false);
      g_remappings[resolved_left] = resolved_right;
      g_unresolved_remappings[left] = right;
    }
  }
}